

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

bool __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::checkSolution(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *lp,
               VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *sol)

{
  uint *puVar1;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar2;
  pointer pnVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  Item *pIVar8;
  int k;
  long lVar9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  activity;
  cpp_dec_float<50U,_int,_void> local_210;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_198;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_158;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_118;
  cpp_dec_float<50U,_int,_void> local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  uVar6 = (ulong)(uint)(lp->
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set.thenum;
  do {
    iVar5 = (int)uVar6;
    if (iVar5 < 1) break;
    uVar6 = uVar6 - 1;
    pIVar8 = (lp->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.theitem +
             (lp->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thekey[uVar6].idx;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              (&local_210,0,(type *)0x0);
    lVar7 = 0;
    for (lVar9 = 0;
        lVar9 < (pIVar8->data).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .memused; lVar9 = lVar9 + 1) {
      pNVar2 = (pIVar8->data).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      local_d8.fpclass = cpp_dec_float_finite;
      local_d8.prec_elem = 10;
      local_d8.data._M_elems[0] = 0;
      local_d8.data._M_elems[1] = 0;
      local_d8.data._M_elems[2] = 0;
      local_d8.data._M_elems[3] = 0;
      local_d8.data._M_elems[4] = 0;
      local_d8.data._M_elems[5] = 0;
      local_d8.data._M_elems._24_5_ = 0;
      local_d8.data._M_elems[7]._1_3_ = 0;
      local_d8.data._M_elems._32_5_ = 0;
      local_d8._37_8_ = 0;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_d8,
                 (cpp_dec_float<50U,_int,_void> *)((long)&(pNVar2->val).m_backend.data + lVar7),
                 &(sol->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start
                  [*(int *)((long)(&pNVar2->val + 1) + lVar7)].m_backend);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                (&local_210,&local_d8);
      lVar7 = lVar7 + 0x3c;
    }
    local_118.m_backend.data._M_elems[8] = local_210.data._M_elems[8];
    local_118.m_backend.data._M_elems[9] = local_210.data._M_elems[9];
    local_118.m_backend.data._M_elems[4] = local_210.data._M_elems[4];
    local_118.m_backend.data._M_elems[5] = local_210.data._M_elems[5];
    local_118.m_backend.data._M_elems[6] = local_210.data._M_elems[6];
    local_118.m_backend.data._M_elems[7] = local_210.data._M_elems[7];
    local_118.m_backend.data._M_elems[0] = local_210.data._M_elems[0];
    local_118.m_backend.data._M_elems[1] = local_210.data._M_elems[1];
    local_118.m_backend.data._M_elems[2] = local_210.data._M_elems[2];
    local_118.m_backend.data._M_elems[3] = local_210.data._M_elems[3];
    local_118.m_backend.exp = local_210.exp;
    local_118.m_backend.neg = local_210.neg;
    local_118.m_backend.fpclass = local_210.fpclass;
    local_118.m_backend.prec_elem = local_210.prec_elem;
    pnVar3 = (lp->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).left.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_158.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar3[uVar6].m_backend.data;
    local_158.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((long)&pnVar3[uVar6].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar3[uVar6].m_backend.data + 0x10);
    local_158.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_158.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    local_158.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((long)&pnVar3[uVar6].m_backend.data + 0x20);
    local_158.m_backend.exp = pnVar3[uVar6].m_backend.exp;
    local_158.m_backend.neg = pnVar3[uVar6].m_backend.neg;
    local_158.m_backend.fpclass = pnVar3[uVar6].m_backend.fpclass;
    local_158.m_backend.prec_elem = pnVar3[uVar6].m_backend.prec_elem;
    feastol(&local_a0,this);
    bVar4 = GE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_118,&local_158,&local_a0);
    if (!bVar4) break;
    local_198.m_backend.data._M_elems[8] = local_210.data._M_elems[8];
    local_198.m_backend.data._M_elems[9] = local_210.data._M_elems[9];
    local_198.m_backend.data._M_elems[4] = local_210.data._M_elems[4];
    local_198.m_backend.data._M_elems[5] = local_210.data._M_elems[5];
    local_198.m_backend.data._M_elems[6] = local_210.data._M_elems[6];
    local_198.m_backend.data._M_elems[7] = local_210.data._M_elems[7];
    local_198.m_backend.data._M_elems[0] = local_210.data._M_elems[0];
    local_198.m_backend.data._M_elems[1] = local_210.data._M_elems[1];
    local_198.m_backend.data._M_elems[2] = local_210.data._M_elems[2];
    local_198.m_backend.data._M_elems[3] = local_210.data._M_elems[3];
    local_198.m_backend.exp = local_210.exp;
    local_198.m_backend.neg = local_210.neg;
    local_198.m_backend.fpclass = local_210.fpclass;
    local_198.m_backend.prec_elem = local_210.prec_elem;
    pnVar3 = (lp->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).right.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_1d8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar3[uVar6].m_backend.data;
    local_1d8.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((long)&pnVar3[uVar6].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar3[uVar6].m_backend.data + 0x10);
    local_1d8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_1d8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    local_1d8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((long)&pnVar3[uVar6].m_backend.data + 0x20);
    local_1d8.m_backend.exp = pnVar3[uVar6].m_backend.exp;
    local_1d8.m_backend.neg = pnVar3[uVar6].m_backend.neg;
    local_1d8.m_backend.fpclass = pnVar3[uVar6].m_backend.fpclass;
    local_1d8.m_backend.prec_elem = pnVar3[uVar6].m_backend.prec_elem;
    feastol(&local_68,this);
    bVar4 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_198,&local_1d8,&local_68);
  } while (bVar4);
  return iVar5 < 1;
}

Assistant:

bool SPxMainSM<R>::checkSolution(SPxLPBase<R>& lp, VectorBase<R> sol)
{
   for(int i = lp.nRows() - 1; i >= 0; --i)
   {
      const SVectorBase<R>& row = lp.rowVector(i);
      R activity = 0;

      for(int k = 0; k < row.size(); k++)
         activity += row.value(k) * sol[row.index(k)];

      if(!GE(activity, lp.lhs(i), feastol()) || !LE(activity, lp.rhs(i), feastol()))
         return false;
   }

   return true;
}